

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::fromString(string_view str)

{
  span<const_slang::logic_t,_18446744073709551615UL> digits_00;
  bool bVar1;
  byte bVar2;
  uint8_t value_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  const_pointer pvVar6;
  size_type sVar7;
  invalid_argument *piVar8;
  undefined8 extraout_RDX;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar9;
  undefined1 in_stack_00000060 [16];
  string_view in_stack_00000070;
  SVInt result;
  logic_t value;
  char d_1;
  SmallVector<slang::logic_t,_40UL> digits;
  bool isUnknown;
  LiteralBase base;
  bitwidth_t bits;
  bool isSigned;
  char d;
  char *tmp;
  char *apostrophe;
  uint32_t possibleSize;
  bool sizeOverflow;
  bool sizeBad;
  bool negative;
  char *end;
  char *c;
  logic_t *in_stack_fffffffffffffdf8;
  SmallVectorBase<slang::logic_t> *in_stack_fffffffffffffe00;
  SmallVector<slang::logic_t,_40UL> *in_stack_fffffffffffffe08;
  uint uVar10;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  SVInt *in_stack_fffffffffffffe38;
  logic_t local_153;
  logic_t local_152;
  char local_151;
  undefined1 in_stack_fffffffffffffed1;
  undefined1 in_stack_fffffffffffffed2;
  LiteralBase in_stack_fffffffffffffed3;
  bitwidth_t in_stack_fffffffffffffed4;
  byte local_10a;
  string local_f8 [39];
  LiteralBase local_d1;
  uint local_d0;
  byte local_ca;
  char local_c9;
  char *local_c8;
  char *local_c0;
  uint local_b8;
  byte local_b3;
  byte local_b2;
  byte local_b1;
  char *local_b0;
  char *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar11;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff88;
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  char *local_40;
  char *local_38;
  undefined8 uStack_30;
  string *local_28;
  char local_19;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  aVar11 = in_RDI;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_90);
  if (bVar1) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"String is empty");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_90);
  local_a8 = pvVar6;
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_90);
  local_b0 = pvVar6 + sVar7;
  local_b1 = *local_a8 == '-';
  if (((*local_a8 == '-') || (*local_a8 == '+')) && (local_a8 = local_a8 + 1, local_a8 == local_b0))
  {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"String only has a sign?");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_b2 = 0;
  local_b3 = 0;
  local_b8 = 0;
  local_c0 = (char *)0x0;
  for (local_c8 = local_a8; local_c8 != local_b0; local_c8 = local_c8 + 1) {
    local_c9 = *local_c8;
    if (local_c9 == '\'') {
      local_c0 = local_c8;
      break;
    }
    bVar1 = isDecimalDigit(local_c9);
    if (bVar1) {
      local_b8 = local_b8 * 10;
      bVar2 = getDigitValue(local_c9);
      local_b8 = bVar2 + local_b8;
      if (0xffffff < local_b8) {
        local_b3 = 1;
      }
    }
    else if (local_c9 != '_') {
      local_b2 = 1;
    }
  }
  local_ca = 1;
  local_d0 = 0x20;
  local_d1 = Decimal;
  if (local_c0 == (char *)0x0) {
    if ((local_b2 & 1) != 0) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Not an integer or sized literal");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    if ((((local_b2 & 1) != 0) || ((local_b3 & 1) != 0)) || (local_b8 == 0)) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar8,"Size is invalid (bad chars or overflow 16 bits)");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_d0 = local_b8;
    local_a8 = local_c0 + 1;
    if (local_a8 == local_b0) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Nothing after size specifier");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if ((*local_a8 == 's') || (*local_a8 == 'S')) {
      local_ca = 1;
      local_a8 = local_c0 + 2;
      if (local_a8 == local_b0) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Nothing after sign specifier");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else {
      local_ca = 0;
    }
    bVar1 = literalBaseFromChar(*local_a8,&local_d1);
    if (!bVar1) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_28 = local_f8;
      local_38 = "Unknown base specifier \'{}\'";
      uStack_30 = 0x1b;
      local_40 = local_a8;
      local_58 = "Unknown base specifier \'{}\'";
      uStack_50 = 0x1b;
      local_19 = *local_a8;
      local_18 = &stack0xffffffffffffff88;
      local_8 = &local_68;
      local_68 = 8;
      local_10 = local_18;
      local_60 = local_18;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_00000070,(format_args)in_stack_00000060);
      std::invalid_argument::invalid_argument(piVar8,local_f8);
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_a8 = local_a8 + 1;
    if (local_a8 == local_b0) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Nothing after base specifier");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  local_10a = 0;
  SmallVector<slang::logic_t,_40UL>::SmallVector((SmallVector<slang::logic_t,_40UL> *)0x203ac3);
  do {
    if (local_a8 == local_b0) {
      uVar3 = (uint)local_d1;
      uVar4 = (uint)local_10a;
      uVar5 = (uint)local_ca;
      uVar10 = local_d0;
      std::span<const_slang::logic_t,_18446744073709551615UL>::
      span<slang::SmallVector<slang::logic_t,_40UL>_&>
                ((span<const_slang::logic_t,_18446744073709551615UL> *)
                 (ulong)CONCAT14(local_10a,uVar5),in_stack_fffffffffffffe08);
      digits_00._M_extent._M_extent_value = in_stack_ffffffffffffff88._M_extent_value;
      digits_00._M_ptr = (pointer)aVar11.val;
      fromDigits(in_stack_fffffffffffffed4,in_stack_fffffffffffffed3,(bool)in_stack_fffffffffffffed2
                 ,(bool)in_stack_fffffffffffffed1,digits_00);
      if ((local_b1 & 1) == 0) {
        SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
              (SVInt *)CONCAT44(uVar3,uVar10));
      }
      else {
        operator-(in_stack_fffffffffffffe38);
      }
      ~SVInt((SVInt *)CONCAT44(uVar4,uVar5));
      SmallVector<slang::logic_t,_40UL>::~SmallVector((SmallVector<slang::logic_t,_40UL> *)0x203cf8)
      ;
      SVar9.super_SVIntStorage.bitWidth = (int)extraout_RDX;
      SVar9.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
      SVar9.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
      SVar9.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
      SVar9.super_SVIntStorage.field_0.val = in_RDI.val;
      return (SVInt)SVar9.super_SVIntStorage;
    }
    local_151 = *local_a8;
    if (local_151 != '_') {
      logic_t::logic_t(&local_152);
      in_stack_fffffffffffffe24 = (int)local_151;
      if (in_stack_fffffffffffffe24 == 0x3f) {
LAB_00203b7a:
        local_152.value = '@';
        local_10a = 1;
      }
      else if (in_stack_fffffffffffffe24 == 0x58) {
LAB_00203b63:
        local_152.value = 0x80;
        local_10a = 1;
      }
      else {
        if (in_stack_fffffffffffffe24 == 0x5a) goto LAB_00203b7a;
        if (in_stack_fffffffffffffe24 == 0x78) goto LAB_00203b63;
        if (in_stack_fffffffffffffe24 == 0x7a) goto LAB_00203b7a;
        value_00 = getHexDigitValue(local_151);
        in_stack_fffffffffffffe20 = CONCAT13(value_00,(int3)in_stack_fffffffffffffe20);
        logic_t::logic_t(&local_153,value_00);
        local_152.value = local_153.value;
      }
      SmallVectorBase<slang::logic_t>::push_back
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

SVInt SVInt::fromString(std::string_view str) {
    if (str.empty())
        SLANG_THROW(std::invalid_argument("String is empty"));

    const char* c = str.data();
    const char* end = c + str.length();
    bool negative = *c == '-';
    if (*c == '-' || *c == '+') {
        c++; // heh
        if (c == end)
            SLANG_THROW(std::invalid_argument("String only has a sign?"));
    }

    // look for a base specifier (optional)
    // along the way we'll keep track of the current decimal value, so that
    // if we find that it's actually a size we'll already be done
    bool sizeBad = false;
    bool sizeOverflow = false;
    uint32_t possibleSize = 0;
    const char* apostrophe = nullptr;
    for (const char* tmp = c; tmp != end; tmp++) {
        char d = *tmp;
        if (d == '\'') {
            // found it, we're done
            apostrophe = tmp;
            break;
        }
        else if (isDecimalDigit(d)) {
            // If the number gets larger than the maximum allowed bit width
            // then this is either not a size or a bad one.
            possibleSize *= 10;
            possibleSize += getDigitValue(d);
            if (possibleSize > MAX_BITS)
                sizeOverflow = true;
        }
        else if (d != '_') {
            // underscores are allowed as digit separators; anything else means this
            // is not a valid bit width
            sizeBad = true;
        }
    }

    // numbers without a size specifier are assumed to be 32 bits, signed, and in decimal base
    bool isSigned = true;
    bitwidth_t bits = 32;
    LiteralBase base = LiteralBase::Decimal;

    if (apostrophe) {
        if (sizeBad || sizeOverflow || possibleSize == 0)
            SLANG_THROW(std::invalid_argument("Size is invalid (bad chars or overflow 16 bits)"));
        bits = possibleSize;

        c = apostrophe + 1;
        if (c == end)
            SLANG_THROW(std::invalid_argument("Nothing after size specifier"));

        if (*c == 's' || *c == 'S') {
            isSigned = true;
            c++;
            if (c == end)
                SLANG_THROW(std::invalid_argument("Nothing after sign specifier"));
        }
        else {
            isSigned = false;
        }

        if (!literalBaseFromChar(*c, base))
            SLANG_THROW(std::invalid_argument(fmt::format("Unknown base specifier '{}'", *c)));

        c++;
        if (c == end)
            SLANG_THROW(std::invalid_argument("Nothing after base specifier"));
    }
    else if (sizeBad) {
        SLANG_THROW(std::invalid_argument("Not an integer or sized literal"));
    }

    // convert the remaining chars to an array of digits to pass to the other
    // constructor
    bool isUnknown = false;
    SmallVector<logic_t> digits;
    for (; c != end; ++c) {
        char d = *c;
        if (d == '_')
            continue;

        logic_t value;
        switch (d) {
            case 'X':
            case 'x':
                value = logic_t::x;
                isUnknown = true;
                break;
            case 'Z':
            case 'z':
            case '?':
                value = logic_t::z;
                isUnknown = true;
                break;
            default:
                value = logic_t(getHexDigitValue(d));
                break;
        }
        digits.push_back(value);
    }

    SVInt result = fromDigits(bits, base, isSigned, isUnknown, digits);

    // if it's supposed to be negative, flip it around
    if (negative)
        return -result;
    else
        return result;
}